

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowAggregateExecutor::WindowAggregateExecutor
          (WindowAggregateExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared,WindowAggregationMode mode)

{
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
  *this_00;
  vector<duckdb::BoundOrderByNode,_true> *this_01;
  _Head_base<0UL,_duckdb::WindowAggregator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  ClientConfig *pCVar4;
  pointer pAVar5;
  idx_t iVar6;
  _Head_base<0UL,_duckdb::WindowAggregator_*,_false> this_02;
  column_t index;
  pointer pEVar7;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_03;
  pointer __pos;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true> *aggr;
  pointer *__ptr;
  LogicalType local_48;
  
  this_00 = &wexpr->aggregate;
  if (((wexpr->aggregate).
       super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
       .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl !=
       (AggregateFunction *)0x0) &&
     (pCVar4 = ClientConfig::GetConfig(context), pCVar4->enable_optimizer == true)) {
    pAVar5 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator->(this_00);
    if (pAVar5->distinct_dependent != DISTINCT_DEPENDENT) {
      wexpr->distinct = false;
    }
    this_01 = &wexpr->arg_orders;
    pAVar5 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator->(this_00);
    if (pAVar5->order_dependent == ORDER_DEPENDENT) {
      iVar6 = BoundWindowExpression::GetSharedOrders(&wexpr->orders,this_01);
      __pos = (wexpr->arg_orders).
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (iVar6 != ((long)(wexpr->arg_orders).
                          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                          .
                          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)__pos >> 3) *
                   -0x5555555555555555) goto LAB_0119272b;
    }
    else {
      __pos = (this_01->
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    }
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
    _M_erase_at_end(&this_01->
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ,__pos);
  }
LAB_0119272b:
  WindowExecutor::WindowExecutor(&this->super_WindowExecutor,wexpr,context,shared);
  (this->super_WindowExecutor)._vptr_WindowExecutor =
       (_func_int **)&PTR__WindowAggregateExecutor_0243ef58;
  this->mode = mode;
  (this->aggregator).
  super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
  .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl = (WindowAggregator *)0x0;
  (this->filter_ref).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  pCVar4 = ClientConfig::GetConfig(context);
  if ((mode == SEPARATE) || (pCVar4->enable_optimizer == false)) {
    this_02._M_head_impl = (WindowAggregator *)operator_new(0x1e8);
    WindowNaiveAggregator::WindowNaiveAggregator
              ((WindowNaiveAggregator *)this_02._M_head_impl,this,shared);
  }
  else if (((((this_00->
              super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
              .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl ==
              (AggregateFunction *)0x0) || (wexpr->distinct != true)) ||
           (wexpr->exclude_clause != NO_OTHER)) ||
          ((wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = WindowConstantAggregator::CanAggregate(wexpr);
    if (bVar3) {
      this_02._M_head_impl = (WindowAggregator *)operator_new(0x1c8);
      WindowConstantAggregator::WindowConstantAggregator
                ((WindowConstantAggregator *)this_02._M_head_impl,wexpr,shared,context);
    }
    else {
      bVar3 = WindowCustomAggregator::CanAggregate(wexpr,mode);
      if (bVar3) {
        this_02._M_head_impl = (WindowAggregator *)operator_new(0x1c8);
        WindowCustomAggregator::WindowCustomAggregator
                  ((WindowCustomAggregator *)this_02._M_head_impl,wexpr,shared);
      }
      else if ((((this_00->
                 super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
                 .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl ==
                 (AggregateFunction *)0x0) || (wexpr->distinct != false)) ||
              ((wexpr->arg_orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (wexpr->arg_orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
        this_02._M_head_impl = (WindowAggregator *)operator_new(0x1e8);
        WindowNaiveAggregator::WindowNaiveAggregator
                  ((WindowNaiveAggregator *)this_02._M_head_impl,this,shared);
      }
      else {
        this_02._M_head_impl = (WindowAggregator *)operator_new(0x1c8);
        WindowSegmentTree::WindowSegmentTree((WindowSegmentTree *)this_02._M_head_impl,wexpr,shared)
        ;
      }
    }
  }
  else {
    this_02._M_head_impl = (WindowAggregator *)operator_new(0x1d0);
    WindowDistinctAggregator::WindowDistinctAggregator
              ((WindowDistinctAggregator *)this_02._M_head_impl,wexpr,shared,context);
  }
  _Var1._M_head_impl =
       (this->aggregator).
       super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
       .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl;
  (this->aggregator).
  super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
  .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl = this_02._M_head_impl;
  if (_Var1._M_head_impl != (WindowAggregator *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregator + 8))();
  }
  if ((wexpr->filter_expr).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    index = WindowSharedExpressions::RegisterExpr(&wexpr->filter_expr,&shared->sink_shared);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&wexpr->filter_expr);
    this_03._M_head_impl = (Expression *)operator_new(0x60);
    LogicalType::LogicalType(&local_48,&pEVar7->return_type);
    BoundReferenceExpression::BoundReferenceExpression
              ((BoundReferenceExpression *)this_03._M_head_impl,&local_48,index);
    LogicalType::~LogicalType(&local_48);
    _Var2._M_head_impl =
         (this->filter_ref).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->filter_ref).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_03._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
  }
  return;
}

Assistant:

WindowAggregateExecutor::WindowAggregateExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                 WindowSharedExpressions &shared, WindowAggregationMode mode)
    : WindowExecutor(SimplifyWindowedAggregate(wexpr, context), context, shared), mode(mode) {

	// Force naive for SEPARATE mode or for (currently!) unsupported functionality
	if (!ClientConfig::GetConfig(context).enable_optimizer || mode == WindowAggregationMode::SEPARATE) {
		aggregator = make_uniq<WindowNaiveAggregator>(*this, shared);
	} else if (WindowDistinctAggregator::CanAggregate(wexpr)) {
		// build a merge sort tree
		// see https://dl.acm.org/doi/pdf/10.1145/3514221.3526184
		aggregator = make_uniq<WindowDistinctAggregator>(wexpr, shared, context);
	} else if (WindowConstantAggregator::CanAggregate(wexpr)) {
		aggregator = make_uniq<WindowConstantAggregator>(wexpr, shared, context);
	} else if (WindowCustomAggregator::CanAggregate(wexpr, mode)) {
		aggregator = make_uniq<WindowCustomAggregator>(wexpr, shared);
	} else if (WindowSegmentTree::CanAggregate(wexpr)) {
		// build a segment tree for frame-adhering aggregates
		// see http://www.vldb.org/pvldb/vol8/p1058-leis.pdf
		aggregator = make_uniq<WindowSegmentTree>(wexpr, shared);
	} else {
		// No accelerator can handle this combination, so fall back to naïve.
		aggregator = make_uniq<WindowNaiveAggregator>(*this, shared);
	}

	// Compute the FILTER with the other eval columns.
	// Anyone who needs it can then convert it to the form they need.
	if (wexpr.filter_expr) {
		const auto filter_idx = shared.RegisterSink(wexpr.filter_expr);
		filter_ref = make_uniq<BoundReferenceExpression>(wexpr.filter_expr->return_type, filter_idx);
	}
}